

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicorn_arm.c
# Opt level: O0

uc_err uc_arm_context_save(uc_struct_conflict *uc,uc_context *context)

{
  uint uVar1;
  CPUState *pCVar2;
  uint *puVar3;
  int *piVar4;
  uint32_t nr;
  CPUARMState *env;
  ARMCPU *cpu;
  char *p;
  uc_context *context_local;
  uc_struct_conflict *uc_local;
  
  pCVar2 = uc->cpu;
  memcpy(&context->field_0x14,uc->cpu->env_ptr,(long)uc->cpu_context_size);
  puVar3 = (uint *)(&context->field_0x14 + uc->cpu_context_size);
  uVar1 = *(uint *)((long)pCVar2[1].tb_jmp_cache + 0x3184);
  if (pCVar2[1].tb_jmp_cache[0x5f4] == (TranslationBlock *)0x0) {
    *puVar3 = 0;
    cpu = (ARMCPU *)(puVar3 + 1);
  }
  else {
    *puVar3 = uVar1;
    memcpy(puVar3 + 1,pCVar2[1].tb_jmp_cache[0x5f4],(ulong)uVar1 << 2);
    cpu = (ARMCPU *)(puVar3 + 1 + uVar1);
  }
  if (pCVar2[1].tb_jmp_cache[0x5f5] == (TranslationBlock *)0x0) {
    (cpu->parent_obj).nr_cores = 0;
    cpu = (ARMCPU *)&(cpu->parent_obj).nr_threads;
  }
  else {
    (cpu->parent_obj).nr_cores = uVar1;
    piVar4 = &(cpu->parent_obj).nr_threads;
    memcpy(piVar4,pCVar2[1].tb_jmp_cache[0x5f5],(ulong)uVar1 << 2);
    cpu = (ARMCPU *)(piVar4 + uVar1);
  }
  if (pCVar2[1].tb_jmp_cache[0x5f6] == (TranslationBlock *)0x0) {
    (cpu->parent_obj).nr_cores = 0;
    cpu = (ARMCPU *)&(cpu->parent_obj).nr_threads;
  }
  else {
    (cpu->parent_obj).nr_cores = uVar1;
    piVar4 = &(cpu->parent_obj).nr_threads;
    memcpy(piVar4,pCVar2[1].tb_jmp_cache[0x5f6],(ulong)uVar1 << 2);
    cpu = (ARMCPU *)(piVar4 + uVar1);
  }
  if (pCVar2[1].tb_jmp_cache[0x5f8] == (TranslationBlock *)0x0) {
    (cpu->parent_obj).nr_cores = 0;
    cpu = (ARMCPU *)&(cpu->parent_obj).nr_threads;
  }
  else {
    (cpu->parent_obj).nr_cores = uVar1;
    piVar4 = &(cpu->parent_obj).nr_threads;
    memcpy(piVar4,pCVar2[1].tb_jmp_cache[0x5f8],(ulong)uVar1 << 2);
    cpu = (ARMCPU *)(piVar4 + uVar1);
  }
  if (pCVar2[1].tb_jmp_cache[0x5f9] == (TranslationBlock *)0x0) {
    (cpu->parent_obj).nr_cores = 0;
    cpu = (ARMCPU *)&(cpu->parent_obj).nr_threads;
  }
  else {
    (cpu->parent_obj).nr_cores = uVar1;
    piVar4 = &(cpu->parent_obj).nr_threads;
    memcpy(piVar4,pCVar2[1].tb_jmp_cache[0x5f9],(ulong)uVar1 << 2);
    cpu = (ARMCPU *)(piVar4 + uVar1);
  }
  if (pCVar2[1].tb_jmp_cache[0x5fa] == (TranslationBlock *)0x0) {
    (cpu->parent_obj).nr_cores = 0;
    cpu = (ARMCPU *)&(cpu->parent_obj).nr_threads;
  }
  else {
    (cpu->parent_obj).nr_cores = uVar1;
    piVar4 = &(cpu->parent_obj).nr_threads;
    memcpy(piVar4,pCVar2[1].tb_jmp_cache[0x5fa],(ulong)uVar1 << 2);
    cpu = (ARMCPU *)(piVar4 + uVar1);
  }
  if (pCVar2[1].tb_jmp_cache[0x5fb] == (TranslationBlock *)0x0) {
    (cpu->parent_obj).nr_cores = 0;
    cpu = (ARMCPU *)&(cpu->parent_obj).nr_threads;
  }
  else {
    (cpu->parent_obj).nr_cores = uVar1;
    piVar4 = &(cpu->parent_obj).nr_threads;
    memcpy(piVar4,pCVar2[1].tb_jmp_cache[0x5fb],(ulong)uVar1 << 2);
    cpu = (ARMCPU *)(piVar4 + uVar1);
  }
  uVar1 = *(uint *)(pCVar2[1].tb_jmp_cache + 0x631);
  if (pCVar2[1].tb_jmp_cache[0x5fe] == (TranslationBlock *)0x0) {
    (cpu->parent_obj).nr_cores = 0;
    cpu = (ARMCPU *)&(cpu->parent_obj).nr_threads;
  }
  else {
    (cpu->parent_obj).nr_cores = uVar1;
    piVar4 = &(cpu->parent_obj).nr_threads;
    memcpy(piVar4,pCVar2[1].tb_jmp_cache[0x5fe],(ulong)uVar1 << 2);
    cpu = (ARMCPU *)(piVar4 + uVar1);
  }
  if (pCVar2[1].tb_jmp_cache[0x5ff] == (TranslationBlock *)0x0) {
    (cpu->parent_obj).nr_cores = 0;
  }
  else {
    (cpu->parent_obj).nr_cores = uVar1;
    memcpy(&(cpu->parent_obj).nr_threads,pCVar2[1].tb_jmp_cache[0x5ff],(ulong)uVar1 << 2);
  }
  return UC_ERR_OK;
}

Assistant:

static uc_err uc_arm_context_save(struct uc_struct *uc, uc_context *context)
{
    char *p = NULL;
    ARMCPU *cpu = (ARMCPU *)uc->cpu;
    CPUARMState *env = (CPUARMState *)&cpu->env;
    uint32_t nr = 0;

#define ARM_ENV_SAVE(field)                                                    \
    if (!field) {                                                              \
        *(uint32_t *)p = 0;                                                    \
        p += sizeof(uint32_t);                                                 \
    } else {                                                                   \
        *(uint32_t *)p = nr;                                                   \
        p += sizeof(uint32_t);                                                 \
        memcpy(p, (void *)field, sizeof(uint32_t) * nr);                       \
        p += sizeof(uint32_t) * nr;                                            \
    }
    p = context->data;
    memcpy(p, uc->cpu->env_ptr, uc->cpu_context_size);
    p += uc->cpu_context_size;

    nr = cpu->pmsav7_dregion;
    ARM_ENV_SAVE(env->pmsav7.drbar)
    ARM_ENV_SAVE(env->pmsav7.drsr)
    ARM_ENV_SAVE(env->pmsav7.dracr)
    ARM_ENV_SAVE(env->pmsav8.rbar[M_REG_NS])
    ARM_ENV_SAVE(env->pmsav8.rbar[M_REG_S])
    ARM_ENV_SAVE(env->pmsav8.rlar[M_REG_NS])
    ARM_ENV_SAVE(env->pmsav8.rlar[M_REG_S])

    nr = cpu->sau_sregion;
    ARM_ENV_SAVE(env->sau.rbar)
    ARM_ENV_SAVE(env->sau.rlar)

#undef ARM_ENV_SAVE
    return UC_ERR_OK;
}